

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayleigh_dist.hpp
# Opt level: O1

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  undefined4 uVar1;
  long lVar2;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  istream *in_00;
  float nu;
  delim_c local_1e;
  delim_c local_1d;
  result_type_conflict1 local_1c;
  
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_1d.c = '(';
  pbVar3 = utility::operator>>(in,&local_1d);
  in_00 = std::istream::_M_extract<float>((float *)pbVar3);
  local_1e.c = ')';
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)in_00,&local_1e);
  lVar2 = *(long *)in;
  if (((byte)in[*(long *)(lVar2 + -0x18) + 0x20] & 5) == 0) {
    P->nu_ = local_1c;
  }
  *(undefined4 *)(in + *(long *)(lVar2 + -0x18) + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &P) {
        float_t nu;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> nu >> utility::delim(')');
        if (in)
          P = rayleigh_dist::param_type(nu);
        in.flags(flags);
        return in;
      }